

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageboxbutton.cpp
# Opt level: O1

QSize __thiscall QtMWidgets::MsgBoxButton::minimumSizeHint(MsgBoxButton *this)

{
  int iVar1;
  QSize QVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 local_40 [8];
  undefined8 local_38;
  undefined8 uStack_30;
  
  QFontMetrics::QFontMetrics((QFontMetrics *)&local_38,(QFont *)(*(long *)&this->field_0x20 + 0x38))
  ;
  iVar1 = QFontMetrics::height();
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_38);
  QFontMetrics::QFontMetrics((QFontMetrics *)local_40,(QFont *)(*(long *)&this->field_0x20 + 0x38));
  local_38._0_4_ = 0;
  local_38._4_4_ = 0;
  uStack_30 = 0xffffffffffffffff;
  auVar5 = QFontMetrics::boundingRect
                     ((QRect *)local_40,(int)&local_38,(QString *)0x84,(int)(this->d).d + 8,
                      (int *)0x0);
  iVar1 = (iVar1 / 3) * 2 + 1;
  iVar3 = (iVar1 - auVar5._0_4_) + auVar5._8_4_;
  iVar4 = (iVar1 - auVar5._4_4_) + auVar5._12_4_;
  QFontMetrics::~QFontMetrics((QFontMetrics *)local_40);
  iVar1 = FingerGeometry::width();
  if (iVar3 <= iVar1) {
    iVar3 = iVar1;
  }
  iVar1 = FingerGeometry::height();
  if (iVar1 < iVar4) {
    iVar1 = iVar4;
  }
  QVar2.ht = iVar1;
  QVar2.wd = iVar3;
  return QVar2;
}

Assistant:

QSize
MsgBoxButton::minimumSizeHint() const
{
	const int margin = fontMetrics().height() / 3;

	const QSize s = fontMetrics()
		.boundingRect( QRect(), Qt::AlignCenter, d->text )
		.marginsAdded( QMargins( margin, margin, margin, margin ) )
		.size();

	return QSize( qMax( s.width(), FingerGeometry::width() ),
		qMax( s.height(), FingerGeometry::height() ) );
}